

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkTSDA::IntToDescriptor
          (ChLinkTSDA *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  ulong uVar13;
  ActualDstType actualDst;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Index dstRows;
  ulong uVar17;
  Index dstRows_1;
  ChVectorRef local_48;
  
  uVar4 = (ulong)off_v;
  iVar12 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])()
  ;
  if (((char)iVar12 == '\0') || (this->m_variables == (ChVariablesGenericDiagonalMass *)0x0)) {
    return;
  }
  uVar17 = (ulong)this->m_nstates;
  pdVar3 = (v->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar3 != (double *)0x0 && (long)uVar17 < 0) {
LAB_0059dc9f:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if ((this->m_nstates < 0) ||
     ((long)((v->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows -
            uVar17) < (long)uVar4)) {
LAB_0059dcc1:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  ChVariables::Get_qb(&local_48,&this->m_variables->super_ChVariables);
  if (local_48.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _8_8_ == uVar17) {
    uVar13 = uVar17;
    if (((local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ & 7) == 0) &&
       (uVar13 = (ulong)(-((uint)((ulong)local_48.
                                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                         ._0_8_ >> 3) & 0x1fffffff) & 7),
       (long)uVar17 <= (long)uVar13)) {
      uVar13 = uVar17;
    }
    uVar15 = uVar17 - uVar13;
    uVar14 = uVar15 + 7;
    if (-1 < (long)uVar15) {
      uVar14 = uVar15;
    }
    if (0 < (long)uVar13) {
      uVar16 = 0;
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar16 * 8) = pdVar3[uVar4 + uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
    uVar14 = (uVar14 & 0xfffffffffffffff8) + uVar13;
    if (7 < (long)uVar15) {
      do {
        pdVar2 = pdVar3 + uVar4 + uVar13;
        dVar5 = pdVar2[1];
        dVar6 = pdVar2[2];
        dVar7 = pdVar2[3];
        dVar8 = pdVar2[4];
        dVar9 = pdVar2[5];
        dVar10 = pdVar2[6];
        dVar11 = pdVar2[7];
        pdVar1 = (double *)
                 (local_48.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._0_8_ + uVar13 * 8);
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar5;
        pdVar1[2] = dVar6;
        pdVar1[3] = dVar7;
        pdVar1[4] = dVar8;
        pdVar1[5] = dVar9;
        pdVar1[6] = dVar10;
        pdVar1[7] = dVar11;
        uVar13 = uVar13 + 8;
      } while ((long)uVar13 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar17) {
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar14 * 8) = pdVar3[uVar4 + uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
    }
    uVar17 = (ulong)this->m_nstates;
    pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if (pdVar3 != (double *)0x0 && (long)uVar17 < 0) goto LAB_0059dc9f;
    if ((this->m_nstates < 0) ||
       ((long)((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              - uVar17) < (long)uVar4)) goto LAB_0059dcc1;
    ChVariables::Get_fb(&local_48,&this->m_variables->super_ChVariables);
    if (local_48.
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ._8_8_ == uVar17) {
      uVar13 = uVar17;
      if (((local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar13 = (ulong)(-((uint)((ulong)local_48.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7),
         (long)uVar17 <= (long)uVar13)) {
        uVar13 = uVar17;
      }
      uVar15 = uVar17 - uVar13;
      uVar14 = uVar15 + 7;
      if (-1 < (long)uVar15) {
        uVar14 = uVar15;
      }
      if (0 < (long)uVar13) {
        uVar16 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar16 * 8) = pdVar3[uVar4 + uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
      }
      uVar14 = (uVar14 & 0xfffffffffffffff8) + uVar13;
      if (7 < (long)uVar15) {
        do {
          pdVar2 = pdVar3 + uVar4 + uVar13;
          dVar5 = pdVar2[1];
          dVar6 = pdVar2[2];
          dVar7 = pdVar2[3];
          dVar8 = pdVar2[4];
          dVar9 = pdVar2[5];
          dVar10 = pdVar2[6];
          dVar11 = pdVar2[7];
          pdVar1 = (double *)
                   (local_48.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._0_8_ + uVar13 * 8);
          *pdVar1 = *pdVar2;
          pdVar1[1] = dVar5;
          pdVar1[2] = dVar6;
          pdVar1[3] = dVar7;
          pdVar1[4] = dVar8;
          pdVar1[5] = dVar9;
          pdVar1[6] = dVar10;
          pdVar1[7] = dVar11;
          uVar13 = uVar13 + 8;
        } while ((long)uVar13 < (long)uVar14);
      }
      if ((long)uVar17 <= (long)uVar14) {
        return;
      }
      do {
        *(double *)
         (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._0_8_ + uVar14 * 8) = pdVar3[uVar4 + uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
      return;
    }
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

void ChLinkTSDA::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                 const ChStateDelta& v,
                                 const ChVectorDynamic<>& R,
                                 const unsigned int off_L,  // offset in L, Qc
                                 const ChVectorDynamic<>& L,
                                 const ChVectorDynamic<>& Qc) {
    if (!IsActive())
        return;

    if (m_variables) {
        m_variables->Get_qb() = v.segment(off_v, m_nstates);
        m_variables->Get_fb() = R.segment(off_v, m_nstates);
    }
}